

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestResult::RecordProperty
          (TestResult *this,string *xml_element,TestProperty *test_property)

{
  bool bVar1;
  char *pcVar2;
  iterator property_with_matching_key;
  MutexLock lock;
  MutexBase *in_stack_fffffffffffffef8;
  TestPropertyKeyIs *in_stack_ffffffffffffff00;
  TestProperty *this_00;
  value_type *in_stack_ffffffffffffff08;
  vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *in_stack_ffffffffffffff10;
  allocator<char> local_b9;
  string local_b8 [16];
  undefined8 in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  string local_78 [64];
  TestProperty *local_38;
  TestProperty *local_30;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  local_28 [5];
  
  bVar1 = ValidateTestProperty(in_stack_ffffffffffffff60,(TestProperty *)in_stack_ffffffffffffff58);
  if (bVar1) {
    internal::GTestMutexLock::GTestMutexLock
              ((GTestMutexLock *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_30 = (TestProperty *)
               std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::begin
                         ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
                          in_stack_fffffffffffffef8);
    local_38 = (TestProperty *)
               std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::end
                         ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
                          in_stack_fffffffffffffef8);
    pcVar2 = TestProperty::key((TestProperty *)0x1ac056);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar2,(allocator *)&stack0xffffffffffffff7b);
    internal::TestPropertyKeyIs::TestPropertyKeyIs
              (in_stack_ffffffffffffff00,(string *)in_stack_fffffffffffffef8);
    local_28[0] = std::
                  find_if<__gnu_cxx::__normal_iterator<testing::TestProperty*,std::vector<testing::TestProperty,std::allocator<testing::TestProperty>>>,testing::internal::TestPropertyKeyIs>
                            ((__normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
                              )in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             (TestPropertyKeyIs *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    internal::TestPropertyKeyIs::~TestPropertyKeyIs((TestPropertyKeyIs *)0x1ac0dd);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7b);
    std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::end
              ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
               in_stack_fffffffffffffef8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
                        *)in_stack_fffffffffffffef8);
    if (bVar1) {
      std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::push_back
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      __gnu_cxx::
      __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
      ::operator->(local_28);
      pcVar2 = TestProperty::value((TestProperty *)0x1ac1ee);
      this_00 = (TestProperty *)&local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,pcVar2,(allocator *)this_00);
      TestProperty::SetValue(this_00,(string *)in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1ac254);
  }
  return;
}

Assistant:

void TestResult::RecordProperty(const std::string& xml_element,
                                const TestProperty& test_property) {
  if (!ValidateTestProperty(xml_element, test_property)) {
    return;
  }
  internal::MutexLock lock(&test_properties_mutex_);
  const std::vector<TestProperty>::iterator property_with_matching_key =
      std::find_if(test_properties_.begin(), test_properties_.end(),
                   internal::TestPropertyKeyIs(test_property.key()));
  if (property_with_matching_key == test_properties_.end()) {
    test_properties_.push_back(test_property);
    return;
  }
  property_with_matching_key->SetValue(test_property.value());
}